

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogCompare.cpp
# Opt level: O0

void __thiscall
ShortResultHandler::testCaseResultComplete(ShortResultHandler *this,TestCaseResultPtr *caseData)

{
  size_type sVar1;
  TestCaseResultData *pTVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  TestCaseResultHeader local_120;
  undefined1 local_d8 [8];
  TestCaseResult fullResult;
  undefined1 local_60 [4];
  int caseNdx;
  TestCaseResultHeader header;
  TestCaseResultPtr *caseData_local;
  ShortResultHandler *this_local;
  
  header.statusDetails.field_2._8_8_ = caseData;
  xe::TestCaseResultHeader::TestCaseResultHeader((TestCaseResultHeader *)local_60);
  sVar1 = std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::size
                    (&this->m_result->resultHeaders);
  pTVar2 = de::SharedPtr<xe::TestCaseResultData>::operator->
                     ((SharedPtr<xe::TestCaseResultData> *)header.statusDetails.field_2._8_8_);
  pcVar3 = xe::TestCaseResultData::getTestCasePath(pTVar2);
  std::__cxx11::string::operator=((string *)local_60,pcVar3);
  header.casePath.field_2._8_4_ = 0;
  pTVar2 = de::SharedPtr<xe::TestCaseResultData>::operator->
                     ((SharedPtr<xe::TestCaseResultData> *)header.statusDetails.field_2._8_8_);
  header.casePath.field_2._12_4_ = xe::TestCaseResultData::getStatusCode(pTVar2);
  pTVar2 = de::SharedPtr<xe::TestCaseResultData>::operator->
                     ((SharedPtr<xe::TestCaseResultData> *)header.statusDetails.field_2._8_8_);
  pcVar3 = xe::TestCaseResultData::getStatusDetails(pTVar2);
  std::__cxx11::string::operator=((string *)&header.caseType,pcVar3);
  if (header.casePath.field_2._12_4_ == 0xe) {
    xe::TestCaseResult::TestCaseResult((TestCaseResult *)local_d8);
    pTVar2 = de::SharedPtr<xe::TestCaseResultData>::get
                       ((SharedPtr<xe::TestCaseResultData> *)header.statusDetails.field_2._8_8_);
    xe::parseTestCaseResultFromData(&this->m_testResultParser,(TestCaseResult *)local_d8,pTVar2);
    xe::TestCaseResultHeader::TestCaseResultHeader(&local_120,(TestCaseResultHeader *)local_d8);
    xe::TestCaseResultHeader::operator=((TestCaseResultHeader *)local_60,&local_120);
    xe::TestCaseResultHeader::~TestCaseResultHeader(&local_120);
    xe::TestCaseResult::~TestCaseResult((TestCaseResult *)local_d8);
  }
  std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::push_back
            (&this->m_result->resultHeaders,(value_type *)local_60);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->m_result->resultMap,(key_type *)local_60);
  *pmVar4 = (mapped_type)sVar1;
  xe::TestCaseResultHeader::~TestCaseResultHeader((TestCaseResultHeader *)local_60);
  return;
}

Assistant:

void testCaseResultComplete (const xe::TestCaseResultPtr& caseData)
	{
		xe::TestCaseResultHeader	header;
		int							caseNdx	= (int)m_result.resultHeaders.size();

		header.casePath			= caseData->getTestCasePath();
		header.caseType			= xe::TESTCASETYPE_SELF_VALIDATE;
		header.statusCode		= caseData->getStatusCode();
		header.statusDetails	= caseData->getStatusDetails();

		if (header.statusCode == xe::TESTSTATUSCODE_LAST)
		{
			xe::TestCaseResult fullResult;

			xe::parseTestCaseResultFromData(&m_testResultParser, &fullResult, *caseData.get());

			header = xe::TestCaseResultHeader(fullResult);
		}

		// Insert into result list & map.
		m_result.resultHeaders.push_back(header);
		m_result.resultMap[header.casePath] = caseNdx;
	}